

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool cmCTestRunTest::StartTest
               (unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner,
               size_t completed,size_t total)

{
  bool bVar1;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_38;
  pointer local_30;
  cmCTestRunTest *testRun;
  size_t total_local;
  size_t completed_local;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner_local;
  
  testRun = (cmCTestRunTest *)total;
  total_local = completed;
  completed_local = (size_t)runner;
  local_30 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::get(runner);
  std::make_unique<cmProcess,std::unique_ptr<cmCTestRunTest,std::default_delete<cmCTestRunTest>>>
            (&local_38);
  std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator=
            (&local_30->TestProcess,
             (unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)&local_38);
  std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
            ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)&local_38);
  bVar1 = StartTest(local_30,total_local,(size_t)testRun);
  if (!bVar1) {
    FinalizeTest(local_30,false);
  }
  return bVar1;
}

Assistant:

bool cmCTestRunTest::StartTest(std::unique_ptr<cmCTestRunTest> runner,
                               size_t completed, size_t total)
{
  auto* testRun = runner.get();

  testRun->TestProcess = cm::make_unique<cmProcess>(std::move(runner));

  if (!testRun->StartTest(completed, total)) {
    testRun->FinalizeTest(false);
    return false;
  }

  return true;
}